

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O2

PackageInfo * __thiscall
tcu::TestPackageRegistry::getPackageInfoByName(TestPackageRegistry *this,char *packageName)

{
  pointer ppPVar1;
  long lVar2;
  bool bVar3;
  int i;
  long lVar4;
  
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    ppPVar1 = (this->m_packageInfos).
              super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_packageInfos).
                            super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1) >> 3) <=
        lVar4) {
      return (PackageInfo *)0x0;
    }
    bVar3 = std::operator==(&ppPVar1[lVar4]->name,packageName);
    lVar2 = lVar4 + 1;
  } while (!bVar3);
  return (this->m_packageInfos).
         super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar4];
}

Assistant:

TestPackageRegistry::PackageInfo* TestPackageRegistry::getPackageInfoByName (const char* packageName) const
{
	for (int i = 0; i < (int)m_packageInfos.size(); i++)
	{
		if (m_packageInfos[i]->name == packageName)
			return m_packageInfos[i];
	}

	return DE_NULL;
}